

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Expression * readE(TokenScanner *scanner,int prec)

{
  int prec_00;
  Expression *rhs_00;
  CompoundExp *this;
  string local_108 [40];
  ErrorException err;
  string local_b8 [32];
  string local_98 [32];
  int local_78;
  int newPrec;
  undefined1 local_68 [40];
  string token;
  Expression *rhs;
  Expression *exp;
  int prec_local;
  TokenScanner *scanner_local;
  
  rhs = readT(scanner);
  std::__cxx11::string::string((string *)(local_68 + 0x20));
  while( true ) {
    TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_68);
    std::__cxx11::string::operator=((string *)(local_68 + 0x20),(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::string(local_98,(string *)(local_68 + 0x20));
    prec_00 = precedence((string *)local_98);
    std::__cxx11::string::~string(local_98);
    local_78 = prec_00;
    if (prec_00 <= prec) break;
    rhs_00 = readE(scanner,prec_00);
    this = (CompoundExp *)operator_new(0x38);
    err._39_1_ = 1;
    std::__cxx11::string::string(local_b8,(string *)(local_68 + 0x20));
    CompoundExp::CompoundExp(this,(string *)local_b8,rhs,rhs_00);
    err._39_1_ = 0;
    std::__cxx11::string::~string(local_b8);
    rhs = (Expression *)this;
  }
  std::__cxx11::string::string(local_108,(string *)(local_68 + 0x20));
  TokenScanner::saveToken(scanner,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  return rhs;
}

Assistant:

Expression *readE(TokenScanner & scanner, int prec) {
   Expression *exp = nullptr;
   Expression *rhs = nullptr;
   exp = readT(scanner);
   string token;
   try {
       while (true) {
           token = scanner.nextToken();
           int newPrec = precedence(token);
           if (newPrec <= prec) break;
           rhs = readE(scanner, newPrec);
           exp = new CompoundExp(token, exp, rhs);
       }
   } catch (ErrorException err) {
       if (exp != nullptr) delete exp;
       if (rhs != nullptr) delete rhs;
   }
   scanner.saveToken(token);
   return exp;
}